

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall
QTextEditPrivate::pageUpDown(QTextEditPrivate *this,MoveOperation op,MoveMode moveMode)

{
  QWidgetData *pQVar1;
  qreal qVar2;
  char cVar3;
  MoveMode MVar4;
  long in_FS_OFFSET;
  ulong uVar5;
  double dVar6;
  double dVar7;
  qreal qVar8;
  QTextCursor cursor;
  QRectF local_58;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)&local_38);
  QWidgetTextControl::cursorRect
            (&local_58,(QWidgetTextControl *)this->control,(QTextCursor *)&local_38);
  dVar7 = 0.0;
  qVar8 = local_58.yp;
  do {
    QWidgetTextControl::cursorRect
              (&local_58,(QWidgetTextControl *)this->control,(QTextCursor *)&local_38);
    qVar2 = local_58.yp;
    cVar3 = QTextCursor::movePosition((MoveOperation)(QWidgetTextControl *)&local_38,op,moveMode);
    if (cVar3 == '\0') goto LAB_0049eca9;
    dVar6 = qVar2 - qVar8;
    uVar5 = -(ulong)(dVar6 < -dVar6);
    pQVar1 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    dVar7 = dVar7 + (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5);
    qVar8 = qVar2;
  } while (dVar7 < (double)(((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1));
  MVar4 = 2;
  if (op == Up) {
    MVar4 = 0xc;
  }
  QTextCursor::movePosition((MoveOperation)&local_38,MVar4,moveMode);
  QAbstractSlider::triggerAction
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,
             (op == Up) + SliderPageStepAdd);
LAB_0049eca9:
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this->control,(QTextCursor *)&local_38,moveMode == KeepAnchor);
  QTextCursor::~QTextCursor((QTextCursor *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::pageUpDown(QTextCursor::MoveOperation op, QTextCursor::MoveMode moveMode)
{
    QTextCursor cursor = control->textCursor();
    bool moved = false;
    qreal lastY = control->cursorRect(cursor).top();
    qreal distance = 0;
    // move using movePosition to keep the cursor's x
    do {
        qreal y = control->cursorRect(cursor).top();
        distance += qAbs(y - lastY);
        lastY = y;
        moved = cursor.movePosition(op, moveMode);
    } while (moved && distance < viewport->height());

    if (moved) {
        if (op == QTextCursor::Up) {
            cursor.movePosition(QTextCursor::Down, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
        } else {
            cursor.movePosition(QTextCursor::Up, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
        }
    }
    control->setTextCursor(cursor, moveMode == QTextCursor::KeepAnchor);
}